

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int QtPrivate::compareStrings(QStringView lhs,QLatin1StringView rhs,CaseSensitivity cs)

{
  int iVar1;
  storage_type_conflict *a;
  size_t blen;
  char *alen;
  char *in_RDX;
  int in_R8D;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char16_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd4;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8D == 1) {
    a = QStringView::utf16(&local_18);
    blen = QStringView::size(&local_18);
    alen = QLatin1StringView::latin1((QLatin1StringView *)&stack0xffffffffffffffd8);
    QLatin1StringView::size((QLatin1StringView *)&stack0xffffffffffffffd8);
    iVar1 = ucstrcmp<char>(a,(size_t)alen,in_stack_ffffffffffffffb0,blen);
  }
  else {
    QStringView::size(&local_18);
    QStringView::utf16(&local_18);
    QLatin1StringView::size((QLatin1StringView *)&stack0xffffffffffffffd8);
    QLatin1StringView::latin1((QLatin1StringView *)&stack0xffffffffffffffd8);
    iVar1 = ucstricmp((qsizetype)in_RDX,in_stack_ffffffffffffffc0,
                      CONCAT44(in_stack_ffffffffffffffd4,in_R8D),in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QtPrivate::compareStrings(QStringView lhs, QLatin1StringView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return ucstrcmp(lhs.utf16(), lhs.size(), rhs.latin1(), rhs.size());
    return ucstricmp(lhs.size(), lhs.utf16(), rhs.size(), rhs.latin1());
}